

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall btSoftBody::updateNormals(btSoftBody *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Face *pFVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Node *pNVar8;
  undefined1 auVar9 [16];
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  lVar10 = (long)(this->m_nodes).m_size;
  if (0 < lVar10) {
    lVar11 = 0;
    do {
      puVar1 = (undefined8 *)((long)(((this->m_nodes).m_data)->m_n).m_floats + lVar11);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar11 = lVar11 + 0x78;
    } while (lVar10 * 0x78 - lVar11 != 0);
  }
  lVar10 = (long)(this->m_faces).m_size;
  if (0 < lVar10) {
    lVar11 = 0;
    do {
      pFVar4 = (this->m_faces).m_data;
      lVar5 = *(long *)((long)pFVar4->m_n + lVar11);
      lVar6 = *(long *)((long)pFVar4->m_n + lVar11 + 8);
      fVar16 = *(float *)(lVar5 + 0x10);
      fVar14 = *(float *)(lVar6 + 0x10) - fVar16;
      lVar7 = *(long *)((long)pFVar4->m_n + lVar11 + 0x10);
      uVar2 = *(undefined8 *)(lVar6 + 0x14);
      uVar3 = *(undefined8 *)(lVar5 + 0x14);
      fVar18 = (float)uVar3;
      fVar15 = (float)((ulong)uVar3 >> 0x20);
      fVar12 = (float)uVar2 - fVar18;
      fVar13 = (float)((ulong)uVar2 >> 0x20) - fVar15;
      fVar18 = *(float *)(lVar7 + 0x14) - fVar18;
      fVar15 = *(float *)(lVar7 + 0x18) - fVar15;
      fVar16 = *(float *)(lVar7 + 0x10) - fVar16;
      fVar17 = fVar12 * fVar15 - fVar18 * fVar13;
      fVar13 = fVar13 * fVar16 - fVar15 * fVar14;
      fVar12 = fVar18 * fVar14 - fVar16 * fVar12;
      fVar16 = fVar12 * fVar12 + fVar17 * fVar17 + fVar13 * fVar13;
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        fVar16 = SQRT(fVar16);
      }
      fVar16 = 1.0 / fVar16;
      auVar9._4_4_ = fVar16 * fVar13;
      auVar9._0_4_ = fVar16 * fVar17;
      auVar9._8_4_ = fVar12 * fVar16;
      auVar9._12_4_ = 0;
      *(undefined1 (*) [16])((long)(pFVar4->m_normal).m_floats + lVar11) = auVar9;
      lVar5 = *(long *)((long)pFVar4->m_n + lVar11);
      *(ulong *)(lVar5 + 0x50) =
           CONCAT44((float)((ulong)*(undefined8 *)(lVar5 + 0x50) >> 0x20) + fVar13,
                    (float)*(undefined8 *)(lVar5 + 0x50) + fVar17);
      *(float *)(lVar5 + 0x58) = *(float *)(lVar5 + 0x58) + fVar12;
      lVar5 = *(long *)((long)pFVar4->m_n + lVar11 + 8);
      *(ulong *)(lVar5 + 0x50) =
           CONCAT44((float)((ulong)*(undefined8 *)(lVar5 + 0x50) >> 0x20) + fVar13,
                    (float)*(undefined8 *)(lVar5 + 0x50) + fVar17);
      *(float *)(lVar5 + 0x58) = *(float *)(lVar5 + 0x58) + fVar12;
      lVar5 = *(long *)((long)pFVar4->m_n + lVar11 + 0x10);
      *(ulong *)(lVar5 + 0x50) =
           CONCAT44((float)((ulong)*(undefined8 *)(lVar5 + 0x50) >> 0x20) + fVar13,
                    (float)*(undefined8 *)(lVar5 + 0x50) + fVar17);
      *(float *)(lVar5 + 0x58) = fVar12 + *(float *)(lVar5 + 0x58);
      lVar11 = lVar11 + 0x48;
    } while (lVar10 * 0x48 != lVar11);
  }
  lVar10 = (long)(this->m_nodes).m_size;
  if (0 < lVar10) {
    lVar11 = 0;
    do {
      pNVar8 = (this->m_nodes).m_data;
      fVar16 = *(float *)((long)(pNVar8->m_n).m_floats + lVar11);
      fVar12 = *(float *)((long)(pNVar8->m_n).m_floats + lVar11 + 4);
      fVar13 = *(float *)((long)(pNVar8->m_n).m_floats + lVar11 + 8);
      fVar16 = fVar13 * fVar13 + fVar16 * fVar16 + fVar12 * fVar12;
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        fVar16 = SQRT(fVar16);
      }
      if (1.1920929e-07 < fVar16) {
        pNVar8 = (this->m_nodes).m_data;
        fVar16 = 1.0 / fVar16;
        uVar2 = *(undefined8 *)((long)(pNVar8->m_n).m_floats + lVar11);
        *(ulong *)((long)(pNVar8->m_n).m_floats + lVar11) =
             CONCAT44(fVar16 * (float)((ulong)uVar2 >> 0x20),fVar16 * (float)uVar2);
        *(float *)((long)(pNVar8->m_n).m_floats + lVar11 + 8) =
             fVar16 * *(float *)((long)(pNVar8->m_n).m_floats + lVar11 + 8);
      }
      lVar11 = lVar11 + 0x78;
    } while (lVar10 * 0x78 - lVar11 != 0);
  }
  return;
}

Assistant:

void					btSoftBody::updateNormals()
{

	const btVector3	zv(0,0,0);
	int i,ni;

	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		m_nodes[i].m_n=zv;
	}
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
		btSoftBody::Face&	f=m_faces[i];
		const btVector3		n=btCross(f.m_n[1]->m_x-f.m_n[0]->m_x,
			f.m_n[2]->m_x-f.m_n[0]->m_x);
		f.m_normal=n.normalized();
		f.m_n[0]->m_n+=n;
		f.m_n[1]->m_n+=n;
		f.m_n[2]->m_n+=n;
	}
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		btScalar len = m_nodes[i].m_n.length();
		if (len>SIMD_EPSILON)
			m_nodes[i].m_n /= len;
	}
}